

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

QHeaderView * __thiscall QAccessibleTableCell::horizontalHeader(QAccessibleTableCell *this)

{
  QTableView *pQVar1;
  QTreeView *this_00;
  QTreeView *tv_1;
  QTableView *tv;
  QHeaderView *header;
  QTableView *in_stack_ffffffffffffffe0;
  undefined8 local_10;
  
  local_10 = (QHeaderView *)0x0;
  ::QPointer::operator_cast_to_QAbstractItemView_((QPointer<QAbstractItemView> *)0x7f8f28);
  pQVar1 = qobject_cast<QTableView_const*>((QObject *)0x7f8f30);
  if (pQVar1 == (QTableView *)0x0) {
    ::QPointer::operator_cast_to_QAbstractItemView_((QPointer<QAbstractItemView> *)0x7f8f5b);
    this_00 = qobject_cast<QTreeView_const*>((QObject *)0x7f8f63);
    if (this_00 != (QTreeView *)0x0) {
      local_10 = QTreeView::header(this_00);
    }
  }
  else {
    local_10 = QTableView::horizontalHeader(in_stack_ffffffffffffffe0);
  }
  return local_10;
}

Assistant:

QHeaderView *QAccessibleTableCell::horizontalHeader() const
{
    QHeaderView *header = nullptr;

    if (false) {
#if QT_CONFIG(tableview)
    } else if (const QTableView *tv = qobject_cast<const QTableView*>(view)) {
        header = tv->horizontalHeader();
#endif
#if QT_CONFIG(treeview)
    } else if (const QTreeView *tv = qobject_cast<const QTreeView*>(view)) {
        header = tv->header();
#endif
    }

    return header;
}